

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *
Lib::List<Inferences::ALASCA::BinaryResolutionConf::Lhs>::cons
          (Lhs *elem,List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *l)

{
  List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *head;
  List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *in_RDI;
  Lhs *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffb4;
  
  head = (List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *)operator_new(0x42920d);
  uVar1 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
  Inferences::ALASCA::BinaryResolutionConf::Lhs::Lhs(&in_RDI->_head,in_stack_ffffffffffffff98);
  List((List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *)
       CONCAT44(in_stack_ffffffffffffffb4,uVar1),&head->_head,in_RDI);
  Inferences::ALASCA::BinaryResolutionConf::Lhs::~Lhs((Lhs *)0x42924d);
  return head;
}

Assistant:

static List* cons(C elem, List* l)
  {
    return new List(elem, l);
  }